

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_invocable.h
# Opt level: O0

void __thiscall
absl::lts_20240722::internal_any_invocable::CoreImpl<false,void,google::protobuf::io::Printer*>::
CoreImpl<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1&,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1>
          (CoreImpl<false,void,google::protobuf::io::Printer*> *this,
          anon_class_1_0_00000001 *param_2)

{
  TargetType kTargetType;
  anon_class_1_0_00000001 *f_local;
  CoreImpl<false,_void,_google::protobuf::io::Printer_*> *this_local;
  
  Initialize<(absl::lts_20240722::internal_any_invocable::CoreImpl<false,void,google::protobuf::io::Printer*>::TargetType)3,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1&,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1,void>
            (this,param_2);
  return;
}

Assistant:

explicit CoreImpl(TypedConversionConstruct<QualDecayedTRef>, F&& f) {
    using DecayedT = RemoveCVRef<QualDecayedTRef>;

    constexpr TargetType kTargetType =
        (std::is_pointer<DecayedT>::value ||
         std::is_member_pointer<DecayedT>::value)
            ? TargetType::kPointer
        : IsCompatibleAnyInvocable<DecayedT>::value
            ? TargetType::kCompatibleAnyInvocable
        : IsAnyInvocable<DecayedT>::value
            ? TargetType::kIncompatibleAnyInvocable
            : TargetType::kOther;
    // NOTE: We only use integers instead of enums as template parameters in
    // order to work around a bug on C++14 under MSVC 2017.
    // See b/236131881.
    Initialize<kTargetType, QualDecayedTRef>(std::forward<F>(f));
  }